

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

IndexPair __thiscall
slang::IntervalMap<unsigned_long,std::monostate,0u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>,true>
          (IntervalMap<unsigned_long,std::monostate,0u> *this,
          LeafNode<unsigned_long,_std::monostate,_11U,_true> *rootNode,uint32_t position,
          allocator_type *alloc)

{
  interval<unsigned_long> *piVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  IndexPair IVar6;
  interval<unsigned_long> *piVar7;
  undefined8 *puVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint uVar11;
  interval<unsigned_long> *piVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  uint32_t sizes [2];
  NodeRef nodes [2];
  uint32_t local_50 [2];
  ulong local_48 [3];
  
  IVar6 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),0xb,local_50,position);
  local_48[0] = 0;
  local_48[1] = 0;
  uVar11 = 0;
  lVar15 = 0;
  do {
    piVar7 = (interval<unsigned_long> *)
             PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    uVar2 = local_50[lVar15];
    piVar12 = piVar7;
    uVar13 = uVar11;
    for (uVar9 = uVar2; uVar9 != 0; uVar9 = uVar9 - 1) {
      piVar1 = (rootNode->
               super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
               ).first + uVar13;
      uVar5 = piVar1->right;
      ((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *)
      &piVar12->left)->first[0].left = piVar1->left;
      piVar12->right = uVar5;
      uVar13 = uVar13 + 1;
      piVar12 = piVar12 + 1;
    }
    uVar11 = uVar11 + uVar2;
    local_48[lVar15] = (ulong)piVar7 & 0xffffffffffffffc0 | (ulong)(uVar2 - 1);
    bVar16 = lVar15 == 0;
    lVar15 = lVar15 + 1;
  } while (bVar16);
  memset(this,0,0xc0);
  lVar15 = 0;
  do {
    uVar3 = local_48[lVar15];
    puVar8 = (undefined8 *)(uVar3 & 0xffffffffffffffc0);
    uVar10 = puVar8[1];
    if (1 < (ulong)local_50[lVar15]) {
      lVar14 = 0;
      do {
        uVar4 = *(ulong *)((long)puVar8 + lVar14 + 0x18);
        if (uVar10 <= uVar4) {
          uVar10 = uVar4;
        }
        lVar14 = lVar14 + 0x10;
      } while ((ulong)local_50[lVar15] * 0x10 + -0x10 != lVar14);
    }
    *(undefined8 *)(this + lVar15 * 0x10 + 0x40) = *puVar8;
    *(ulong *)(this + lVar15 * 0x10 + 0x48) = uVar10;
    *(ulong *)(this + lVar15 * 8) = uVar3;
    bVar16 = lVar15 == 0;
    lVar15 = lVar15 + 1;
  } while (bVar16);
  *(undefined4 *)(this + 0xc4) = 2;
  *(int *)(this + 0xc0) = *(int *)(this + 0xc0) + 1;
  return IVar6;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}